

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::InsertLocalMinimaIntoAEL(Clipper *this,cInt botY)

{
  _func_int *p_Var1;
  long *plVar2;
  TEdge *edge;
  TEdge *edge_00;
  Join *pJVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  OutPt *op2;
  pointer ppJVar7;
  OutPt *pOVar8;
  long lVar9;
  long *unaff_RBX;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  TEdge *pTVar14;
  IntPoint OffPt;
  cInt local_48;
  TEdge **local_40;
  long local_38;
  
  local_40 = &this->m_SortedEdges;
  local_38 = botY;
  do {
    p_Var1 = this->_vptr_Clipper[-3];
    plVar2 = *(long **)(p_Var1 + (long)&(this->m_Joins).
                                        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                       );
    if ((plVar2 == *(long **)(p_Var1 + 0x10 +
                             (long)&(this->m_Joins).
                                    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                             )) || (*plVar2 != local_38)) {
      bVar6 = false;
    }
    else {
      *(long **)(p_Var1 + (long)&(this->m_Joins).
                                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                ) = plVar2 + 3;
      bVar6 = true;
      unaff_RBX = plVar2;
    }
    if (!bVar6) {
      return;
    }
    edge = (TEdge *)unaff_RBX[1];
    edge_00 = (TEdge *)unaff_RBX[2];
    if (edge == (TEdge *)0x0) {
      InsertEdgeIntoAEL(this,edge_00,(TEdge *)0x0);
      SetWindingCount(this,edge_00);
      bVar6 = IsContributing(this,edge_00);
      op2 = (OutPt *)0x0;
      if (bVar6) {
        op2 = AddOutPt(this,edge_00,(IntPoint *)edge_00);
      }
    }
    else {
      InsertEdgeIntoAEL(this,edge,(TEdge *)0x0);
      if (edge_00 == (TEdge *)0x0) {
        SetWindingCount(this,edge);
        bVar6 = IsContributing(this,edge);
        if (!bVar6) goto LAB_00110098;
        op2 = AddOutPt(this,edge,(IntPoint *)edge);
      }
      else {
        InsertEdgeIntoAEL(this,edge_00,edge);
        SetWindingCount(this,edge);
        edge_00->WindCnt = edge->WindCnt;
        edge_00->WindCnt2 = edge->WindCnt2;
        bVar6 = IsContributing(this,edge);
        if (bVar6) {
          op2 = AddLocalMinPoly(this,edge,edge_00,(IntPoint *)edge);
        }
        else {
LAB_00110098:
          op2 = (OutPt *)0x0;
        }
      }
      local_48 = (edge->Top).Y;
      std::
      priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
      ::push((priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
              *)(this->_vptr_Clipper[-3] + (long)local_40),&local_48);
    }
    if (edge_00 != (TEdge *)0x0) {
      if ((edge_00->Dx != -1e+40) || (NAN(edge_00->Dx))) {
        local_48 = (edge_00->Top).Y;
        p_Var1 = this->_vptr_Clipper[-3];
      }
      else {
        pTVar14 = this->m_SortedEdges;
        if (pTVar14 == (TEdge *)0x0) {
          this->m_SortedEdges = edge_00;
          edge_00->NextInSEL = (TEdge *)0x0;
          edge_00->PrevInSEL = (TEdge *)0x0;
        }
        else {
          edge_00->NextInSEL = pTVar14;
          edge_00->PrevInSEL = (TEdge *)0x0;
          pTVar14->PrevInSEL = edge_00;
          this->m_SortedEdges = edge_00;
        }
        if (edge_00->NextInLML == (TEdge *)0x0) goto LAB_00110147;
        local_48 = (edge_00->NextInLML->Top).Y;
        p_Var1 = this->_vptr_Clipper[-3];
      }
      std::
      priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
      ::push((priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
              *)(p_Var1 + (long)local_40),&local_48);
    }
LAB_00110147:
    if (edge != (TEdge *)0x0 && edge_00 != (TEdge *)0x0) {
      if (((((op2 != (OutPt *)0x0) && (edge_00->Dx == -1e+40)) && (!NAN(edge_00->Dx))) &&
          (((this->m_GhostJoins).
            super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->m_GhostJoins).
            super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
            super__Vector_impl_data._M_start && (edge_00->WindDelta != 0)))) &&
         (ppJVar7 = (this->m_GhostJoins).
                    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
         (this->m_GhostJoins).
         super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
         super__Vector_impl_data._M_finish != ppJVar7)) {
        uVar13 = 0;
        do {
          pJVar3 = ppJVar7[uVar13];
          lVar4 = (pJVar3->OffPt).X;
          lVar9 = (pJVar3->OutPt1->Pt).X;
          lVar5 = (edge_00->Bot).X;
          lVar11 = (edge_00->Top).X;
          lVar12 = lVar4;
          if (lVar9 < lVar4) {
            lVar12 = lVar9;
          }
          if (lVar9 <= lVar4) {
            lVar9 = lVar4;
          }
          lVar10 = lVar11;
          if (lVar5 < lVar11) {
            lVar10 = lVar5;
          }
          if (lVar11 < lVar5) {
            lVar11 = lVar5;
          }
          if ((lVar12 < lVar11) && (lVar10 < lVar9)) {
            OffPt.Y = (pJVar3->OffPt).Y;
            OffPt.X = lVar4;
            AddJoin(this,pJVar3->OutPt1,op2,OffPt);
          }
          uVar13 = uVar13 + 1;
          ppJVar7 = (this->m_GhostJoins).
                    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)(this->m_GhostJoins).
                                        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar7
                                 >> 3));
      }
      if ((((-1 < edge->OutIdx) && (pTVar14 = edge->PrevInAEL, pTVar14 != (TEdge *)0x0)) &&
          ((pTVar14->Curr).X == (edge->Bot).X)) &&
         (((-1 < pTVar14->OutIdx &&
           (bVar6 = SlopesEqual(pTVar14->Bot,pTVar14->Top,edge->Curr,edge->Top,
                                (bool)(this->_vptr_Clipper[-3] + 8)
                                      [(long)&(this->m_GhostJoins).
                                              super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                      ]), bVar6)) &&
          ((edge->WindDelta != 0 && (pTVar14->WindDelta != 0)))))) {
        pOVar8 = AddOutPt(this,pTVar14,(IntPoint *)edge);
        AddJoin(this,op2,pOVar8,edge->Top);
      }
      if (edge->NextInAEL != edge_00) {
        if (((-1 < edge_00->OutIdx) && (pTVar14 = edge_00->PrevInAEL, -1 < pTVar14->OutIdx)) &&
           ((bVar6 = SlopesEqual(pTVar14->Curr,pTVar14->Top,edge_00->Curr,edge_00->Top,
                                 (bool)(this->_vptr_Clipper[-3] + 8)
                                       [(long)&(this->m_GhostJoins).
                                               super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                       ]), bVar6 &&
            ((edge_00->WindDelta != 0 && (pTVar14->WindDelta != 0)))))) {
          pOVar8 = AddOutPt(this,pTVar14,(IntPoint *)edge_00);
          AddJoin(this,op2,pOVar8,edge_00->Top);
        }
        pTVar14 = edge->NextInAEL;
        if (pTVar14 != edge_00 && pTVar14 != (TEdge *)0x0) {
          do {
            IntersectEdges(this,edge_00,pTVar14,&edge->Curr);
            pTVar14 = pTVar14->NextInAEL;
          } while (pTVar14 != edge_00);
        }
      }
    }
  } while( true );
}

Assistant:

void Clipper::InsertLocalMinimaIntoAEL(const cInt botY)
{
  const LocalMinimum *lm;
  while (PopLocalMinima(botY, lm))
  {
    TEdge* lb = lm->LeftBound;
    TEdge* rb = lm->RightBound;
    
    OutPt *Op1 = 0;
    if (!lb)
    {
      //nb: don't insert LB into either AEL or SEL
      InsertEdgeIntoAEL(rb, 0);
      SetWindingCount(*rb);
      if (IsContributing(*rb))
        Op1 = AddOutPt(rb, rb->Bot); 
    } 
    else if (!rb)
    {
      InsertEdgeIntoAEL(lb, 0);
      SetWindingCount(*lb);
      if (IsContributing(*lb))
        Op1 = AddOutPt(lb, lb->Bot);
      InsertScanbeam(lb->Top.Y);
    }
    else
    {
      InsertEdgeIntoAEL(lb, 0);
      InsertEdgeIntoAEL(rb, lb);
      SetWindingCount( *lb );
      rb->WindCnt = lb->WindCnt;
      rb->WindCnt2 = lb->WindCnt2;
      if (IsContributing(*lb))
        Op1 = AddLocalMinPoly(lb, rb, lb->Bot);      
      InsertScanbeam(lb->Top.Y);
    }

     if (rb)
     {
		 if (IsHorizontal(*rb))
		 {
			 AddEdgeToSEL(rb);
			 if (rb->NextInLML) 
				 InsertScanbeam(rb->NextInLML->Top.Y);
		 }
		 else InsertScanbeam( rb->Top.Y );
     }

    if (!lb || !rb) continue;

    //if any output polygons share an edge, they'll need joining later ...
    if (Op1 && IsHorizontal(*rb) && 
      m_GhostJoins.size() > 0 && (rb->WindDelta != 0))
    {
      for (JoinList::size_type i = 0; i < m_GhostJoins.size(); ++i)
      {
        Join* jr = m_GhostJoins[i];
        //if the horizontal Rb and a 'ghost' horizontal overlap, then convert
        //the 'ghost' join to a real join ready for later ...
        if (HorzSegmentsOverlap(jr->OutPt1->Pt.X, jr->OffPt.X, rb->Bot.X, rb->Top.X))
          AddJoin(jr->OutPt1, Op1, jr->OffPt);
      }
    }

    if (lb->OutIdx >= 0 && lb->PrevInAEL && 
      lb->PrevInAEL->Curr.X == lb->Bot.X &&
      lb->PrevInAEL->OutIdx >= 0 &&
      SlopesEqual(lb->PrevInAEL->Bot, lb->PrevInAEL->Top, lb->Curr, lb->Top, m_UseFullRange) &&
      (lb->WindDelta != 0) && (lb->PrevInAEL->WindDelta != 0))
    {
        OutPt *Op2 = AddOutPt(lb->PrevInAEL, lb->Bot);
        AddJoin(Op1, Op2, lb->Top);
    }

    if(lb->NextInAEL != rb)
    {

      if (rb->OutIdx >= 0 && rb->PrevInAEL->OutIdx >= 0 &&
        SlopesEqual(rb->PrevInAEL->Curr, rb->PrevInAEL->Top, rb->Curr, rb->Top, m_UseFullRange) &&
        (rb->WindDelta != 0) && (rb->PrevInAEL->WindDelta != 0))
      {
          OutPt *Op2 = AddOutPt(rb->PrevInAEL, rb->Bot);
          AddJoin(Op1, Op2, rb->Top);
      }

      TEdge* e = lb->NextInAEL;
      if (e)
      {
        while( e != rb )
        {
          //nb: For calculating winding counts etc, IntersectEdges() assumes
          //that param1 will be to the Right of param2 ABOVE the intersection ...
          IntersectEdges(rb , e , lb->Curr); //order important here
          e = e->NextInAEL;
        }
      }
    }
    
  }
}